

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableModel.cpp
# Opt level: O3

TableModel<trackerboy::Instrument> * __thiscall
TableModel<trackerboy::Instrument>::iconData(TableModel<trackerboy::Instrument> *this,int id)

{
  ChType CVar1;
  Module *this_00;
  InstrumentTable *this_01;
  Instrument *this_02;
  int in_EDX;
  Icons type;
  undefined4 in_register_00000034;
  
  this_00 = Module::data(*(Module **)(CONCAT44(in_register_00000034,id) + 0x10));
  this_01 = trackerboy::Module::instrumentTable(this_00);
  this_02 = trackerboy::Table<trackerboy::Instrument>::get(this_01,in_EDX);
  CVar1 = trackerboy::Instrument::channel(this_02);
  type = ch4;
  if (CVar1 < ch4) {
    type = CVar1 + ch1;
  }
  IconLocator::get((IconLocator *)this,type);
  return this;
}

Assistant:

QIcon TableModel<T>::iconData(int id) const {
    if constexpr (std::is_same_v<T, trackerboy::Instrument>) {
        auto ch = source().get(id)->channel();
        Icons icons;
        switch (ch) {
            case trackerboy::ChType::ch1:
                icons = Icons::ch1;
                break;
            case trackerboy::ChType::ch2:
                icons = Icons::ch2;
                break;
            case trackerboy::ChType::ch3:
                icons = Icons::ch3;
                break;
            default:
                icons = Icons::ch4;
                break;

        }

        return IconLocator::get(icons);
    } else {
        // no icons for waveforms (yet, potential TODO)
        Q_UNUSED(id);
        return {};
    }
}